

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O0

int If_CutPerformCheck75__(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  int iVar1;
  uint uVar2;
  int local_460;
  int local_45c;
  int nVarsMin;
  int v;
  word pCof1 [2];
  word pCof0 [2];
  word *pT;
  int nDecAndExists;
  int nDecExists;
  int nSizeNonDec;
  char pDsdStr [1000];
  char *pStr_local;
  int nLeaves_local;
  int nVars_local;
  uint *pTruth_local;
  If_Man_t *p_local;
  
  If_CutPerformCheck75__::Counter = If_CutPerformCheck75__::Counter + 1;
  if (nLeaves < 6) {
    p_local._4_4_ = 1;
  }
  else {
    pDsdStr._992_8_ = pStr;
    if (8 < nLeaves) {
      __assert_fail("nLeaves <= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec75.c"
                    ,0xd4,"int If_CutPerformCheck75__(If_Man_t *, unsigned int *, int, int, char *)"
                   );
    }
    if ((nLeaves < 8) && (iVar1 = If_CutPerformCheck16(p,pTruth,nVars,nLeaves,"44"), iVar1 != 0)) {
      p_local._4_4_ = 1;
    }
    else {
      iVar1 = Dau_DsdDecompose((word *)pTruth,nLeaves,0,0,(char *)&nDecExists);
      if (nLeaves == 8) {
        if (iVar1 < 5) {
          uVar2 = Dau_DsdCheckDecAndExist((char *)&nDecExists);
          if ((uVar2 & 0x10) == 0) {
            p_local._4_4_ = 0;
          }
          else {
            p_local._4_4_ = 1;
          }
        }
        else {
          p_local._4_4_ = 0;
        }
      }
      else if (nLeaves == 7) {
        if (iVar1 < 5) {
          uVar2 = Dau_DsdCheckDecExist((char *)&nDecExists);
          if ((uVar2 & 0x10) != 0) {
            return 1;
          }
          uVar2 = Dau_DsdCheckDecAndExist((char *)&nDecExists);
          if ((uVar2 & 0x18) != 0) {
            return 1;
          }
        }
        for (local_45c = 0; local_45c < 7; local_45c = local_45c + 1) {
          _nVarsMin = *(word *)pTruth;
          pCof1[0] = *(word *)(pTruth + 2);
          pCof1[1] = _nVarsMin;
          Abc_TtCofactor0(pCof1 + 1,2,local_45c);
          Abc_TtCofactor1((word *)&nVarsMin,2,local_45c);
          iVar1 = Abc_TtSupportSize(pCof1 + 1,7);
          if (iVar1 < 4) {
            If_Dec7MinimumBase((word *)&nVarsMin,(int *)0x0,7,&local_460);
            iVar1 = Dau_DsdDecompose((word *)&nVarsMin,local_460,0,0,(char *)&nDecExists);
            if ((iVar1 < 5) &&
               (uVar2 = Dau_DsdCheckDecExist((char *)&nDecExists), (uVar2 & 0x18) != 0)) {
              return 1;
            }
          }
          else {
            iVar1 = Abc_TtSupportSize((word *)&nVarsMin,7);
            if (iVar1 < 4) {
              If_Dec7MinimumBase(pCof1 + 1,(int *)0x0,7,&local_460);
              iVar1 = Dau_DsdDecompose(pCof1 + 1,local_460,0,0,(char *)&nDecExists);
              if ((iVar1 < 5) &&
                 (uVar2 = Dau_DsdCheckDecExist((char *)&nDecExists), (uVar2 & 0x18) != 0)) {
                return 1;
              }
            }
          }
        }
        p_local._4_4_ = 0;
      }
      else {
        if (nLeaves != 6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec75.c"
                        ,0x120,
                        "int If_CutPerformCheck75__(If_Man_t *, unsigned int *, int, int, char *)");
        }
        if (iVar1 < 5) {
          uVar2 = Dau_DsdCheckDecExist((char *)&nDecExists);
          if ((uVar2 & 0x18) != 0) {
            return 1;
          }
          uVar2 = Dau_DsdCheckDecAndExist((char *)&nDecExists);
          if ((uVar2 & 0x1c) != 0) {
            return 1;
          }
        }
        p_local._4_4_ = If_CutPerformCheck07(p,pTruth,nVars,6,(char *)pDsdStr._992_8_);
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutPerformCheck75__( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
    char pDsdStr[1000];
    int nSizeNonDec, nDecExists, nDecAndExists;
    static int Counter = 0;
    Counter++;
    if ( nLeaves < 6 )
        return 1;
    assert( nLeaves <= 8 );
    if ( nLeaves < 8 && If_CutPerformCheck16( p, pTruth, nVars, nLeaves, "44" ) )
        return 1;
    // check decomposability
    nSizeNonDec = Dau_DsdDecompose( (word *)pTruth, nLeaves, 0, 0, pDsdStr );
//    printf( "Vars = %d  %s", nLeaves, pDsdStr );    printf( "\n" );
//    Extra_PrintBinary( stdout, &nDecExists, 8 );    printf( "\n" );
//    Extra_PrintBinary( stdout, &nDecAndExists, 8 ); printf( "\n" );
    if ( nLeaves == 8 )
    {
        if ( nSizeNonDec >= 5 )
            return 0;
        nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
        if ( nDecAndExists & 0x10 ) // bit 4
            return 1;
        else
            return 0;
    }
    if ( nLeaves == 7 )
    {
        extern void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars );
        word * pT = (word *)pTruth;
        word pCof0[2], pCof1[2];
        int v, nVarsMin;
        if ( nSizeNonDec < 5 )
        {
            nDecExists = Dau_DsdCheckDecExist( pDsdStr );
            if ( nDecExists & 0x10 ) // bit 4
                return 1;
            nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
            if ( nDecAndExists & 0x18 ) // bit 4, 3
                return 1;
        }
        // check cofactors
        for ( v = 0; v < 7; v++ )
        {
            pCof0[0] = pCof1[0] = pT[0];
            pCof0[1] = pCof1[1] = pT[1];
            Abc_TtCofactor0( pCof0, 2, v );
            Abc_TtCofactor1( pCof1, 2, v );
            if ( Abc_TtSupportSize(pCof0, 7) < 4 )
            {
                If_Dec7MinimumBase( pCof1, NULL, 7, &nVarsMin );
                nSizeNonDec = Dau_DsdDecompose( pCof1, nVarsMin, 0, 0, pDsdStr );
                if ( nSizeNonDec >= 5 )
                    continue;
                nDecExists = Dau_DsdCheckDecExist( pDsdStr );
                if ( nDecExists & 0x18 ) // bit 4, 3
                    return 1;
            }
            else if ( Abc_TtSupportSize(pCof1, 7) < 4 )
            {
                If_Dec7MinimumBase( pCof0, NULL, 7, &nVarsMin );
                nSizeNonDec = Dau_DsdDecompose( pCof0, nVarsMin, 0, 0, pDsdStr );
                if ( nSizeNonDec >= 5 )
                    continue;
                nDecExists = Dau_DsdCheckDecExist( pDsdStr );
                if ( nDecExists & 0x18 ) // bit 4, 3
                    return 1;
            }
        }
        return 0;
    }
    if ( nLeaves == 6 )
    {
        if ( nSizeNonDec < 5 )
        {
            nDecExists = Dau_DsdCheckDecExist( pDsdStr );
            if ( nDecExists & 0x18 ) // bit 4, 3
                return 1;
            nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
            if ( nDecAndExists & 0x1C ) // bit 4, 3, 2
                return 1;
        }
        return If_CutPerformCheck07( p, pTruth, nVars, nLeaves, pStr );
    }
    assert( 0 );
    return 0;
}